

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O3

void jsgf_rhs_free(jsgf_rhs_t *rhs)

{
  glist_t pgVar1;
  
  if (rhs != (jsgf_rhs_t *)0x0) {
    jsgf_rhs_free(rhs->alt);
    pgVar1 = rhs->atoms;
    if (pgVar1 == (glist_t)0x0) {
      pgVar1 = (glist_t)0x0;
    }
    else {
      do {
        jsgf_atom_free((jsgf_atom_t *)(pgVar1->data).ptr);
        pgVar1 = pgVar1->next;
      } while (pgVar1 != (gnode_s *)0x0);
      pgVar1 = rhs->atoms;
    }
    glist_free(pgVar1);
    ckd_free(rhs);
    return;
  }
  return;
}

Assistant:

static void
jsgf_rhs_free(jsgf_rhs_t * rhs)
{
    gnode_t *gn;

    if (rhs == NULL)
        return;

    jsgf_rhs_free(rhs->alt);
    for (gn = rhs->atoms; gn; gn = gnode_next(gn))
        jsgf_atom_free(gnode_ptr(gn));
    glist_free(rhs->atoms);
    ckd_free(rhs);
}